

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::FillExtensionToLanguageMap(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  pointer pbVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined8 uVar4;
  cmMakefile *this_00;
  long *plVar5;
  undefined8 *puVar6;
  string *arg;
  mapped_type *pmVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar8;
  pointer pbVar9;
  string *i;
  key_type *__k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string extensionsVar;
  undefined1 local_d8 [24];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer *local_98;
  long local_90;
  pointer local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  cmMakefile *local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_","");
  pcVar3 = (l->_M_dataplus)._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar3,pcVar3 + l->_M_string_length)
  ;
  uVar8 = 0xf;
  if (local_58 != local_48) {
    uVar8 = local_48[0];
  }
  local_38 = mf;
  if (uVar8 < (ulong)(local_70 + local_50)) {
    uVar8 = 0xf;
    if (local_78 != local_68) {
      uVar8 = local_68[0];
    }
    if (uVar8 < (ulong)(local_70 + local_50)) goto LAB_0019a2f6;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_0019a2f6:
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  pbVar1 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar1) {
    local_d8._16_8_ = (pbVar1->_M_dataplus)._M_p;
    uStack_c0 = (undefined4)plVar5[3];
    uStack_bc = *(undefined4 *)((long)plVar5 + 0x1c);
  }
  else {
    local_d8._16_8_ = (pbVar1->_M_dataplus)._M_p;
    local_d8._0_8_ = (pointer)*plVar5;
  }
  local_d8._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar1;
  plVar5[1] = 0;
  *(undefined1 *)&(pbVar1->_M_dataplus)._M_p = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_SOURCE_FILE_EXTENSIONS","");
  pbVar1 = (pointer)((long)&((_Alloc_hider *)local_d8._8_8_)->_M_p + local_90);
  pbVar9 = (pointer)0xf;
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    pbVar9 = (pointer)local_d8._16_8_;
  }
  if (pbVar9 < pbVar1) {
    pbVar9 = (pointer)0xf;
    if (local_98 != local_88) {
      pbVar9 = local_88[0];
    }
    if (pbVar1 <= pbVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,local_d8._0_8_);
      goto LAB_0019a3d5;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_d8,(ulong)local_98);
LAB_0019a3d5:
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  psVar2 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_a8._M_allocated_capacity = *psVar2;
    local_a8._8_8_ = puVar6[3];
  }
  else {
    local_a8._M_allocated_capacity = *psVar2;
    local_b8._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar6;
  }
  local_b8._8_8_ = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&(local_88[0]->_M_dataplus)._M_p + 1));
  }
  this_00 = local_38;
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  arg = cmMakefile::GetSafeDefinition(this_00,(string *)&local_b8);
  local_d8._0_8_ = (key_type *)0x0;
  local_d8._8_8_ = (key_type *)0x0;
  local_d8._16_8_ = (pointer)0x0;
  cmSystemTools::ExpandListArgument
            (arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8,false);
  uVar4 = local_d8._8_8_;
  if (local_d8._0_8_ != local_d8._8_8_) {
    __k = (key_type *)local_d8._0_8_;
    do {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ExtensionToLanguage,__k);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      __k = __k + 1;
    } while (__k != (key_type *)uVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  const std::string& exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::string const& i : extensionList) {
    this->ExtensionToLanguage[i] = l;
  }
}